

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

int run_test_condvar_4(void)

{
  uv_mutex_t *mutex;
  short sVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uint64_t uVar4;
  uint64_t uVar5;
  uv_loop_t *puVar6;
  ulong uVar7;
  int iVar8;
  sockaddr_in *addr;
  short *psVar9;
  code *loop;
  char *pcVar10;
  uv_connect_t *puVar11;
  uv_tcp_t *puVar12;
  bool bVar13;
  uv_thread_t thread;
  worker_config_conflict wc;
  sockaddr_in sStack_4d8;
  sockaddr_in sStack_4c8;
  uv_loop_t *puStack_4b8;
  uv_loop_t *puStack_4b0;
  code *pcStack_4a8;
  code *pcStack_4a0;
  sockaddr_in sStack_48c;
  sockaddr_in6 sStack_47c;
  uv_connect_t uStack_460;
  uv_tcp_t uStack_400;
  uv_connect_t uStack_308;
  uv_tcp_t uStack_2a8;
  uint64_t uStack_1b0;
  ulong uStack_1a8;
  worker_config_conflict wStack_1a0;
  worker_config_conflict *pwStack_e8;
  uv_thread_t uStack_c8;
  worker_config_conflict local_c0;
  
  worker_config_init(&local_c0,1,condvar_signal,condvar_timedwait);
  iVar2 = uv_thread_create(&uStack_c8,worker,&local_c0);
  if (iVar2 == 0) {
    (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
    iVar2 = uv_thread_join(&uStack_c8);
    if (iVar2 == 0) {
      worker_config_destroy(&local_c0);
      return 0;
    }
  }
  else {
    run_test_condvar_4_cold_1();
  }
  run_test_condvar_4_cold_2();
  uStack_1a8 = 0x14ad8f;
  pwStack_e8 = &local_c0;
  worker_config_init(&wStack_1a0,0,(signal_func)0x0,(wait_func)0x0);
  mutex = &wStack_1a0.mutex;
  uStack_1a8 = 0x14ad9c;
  uv_mutex_lock(mutex);
  uStack_1a8 = 0x14ada1;
  uVar4 = uv_hrtime();
  uStack_1a8 = 0x14adb6;
  uVar3 = uv_cond_timedwait(&wStack_1a0.cond,mutex,100000000);
  uStack_1a8 = 0x14adbd;
  uVar5 = uv_hrtime();
  uStack_1a8 = 0x14adc8;
  uv_mutex_unlock(mutex);
  if (uVar3 == 0xffffff92) {
    if (uVar5 - uVar4 < 75000000) goto LAB_0014adff;
    if (uVar5 - uVar4 < 0x1dcd6501) {
      uStack_1a8 = 0x14adea;
      worker_config_destroy(&wStack_1a0);
      return 0;
    }
  }
  else {
    uStack_1a8 = 0x14adff;
    run_test_condvar_5_cold_1();
LAB_0014adff:
    uStack_1a8 = 0x14ae04;
    run_test_condvar_5_cold_2();
  }
  uStack_1a8 = 0x14ae09;
  run_test_condvar_5_cold_3();
  pcStack_4a0 = (code *)0x14ae1a;
  uStack_1b0 = uVar4;
  uStack_1a8 = (ulong)uVar3;
  puVar6 = uv_default_loop();
  puVar12 = &uStack_2a8;
  pcStack_4a0 = (code *)0x14ae2d;
  iVar2 = uv_tcp_init(puVar6,puVar12);
  iVar8 = (int)puVar12;
  if (iVar2 == 0) {
    iVar8 = 0x23a3;
    pcStack_4a0 = (code *)0x14ae4b;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_48c);
    if (iVar2 != 0) goto LAB_0014af63;
    puVar12 = &uStack_2a8;
    pcStack_4a0 = (code *)0x14ae74;
    iVar2 = uv_tcp_connect(&uStack_308,puVar12,(sockaddr *)&sStack_48c,connect_4);
    iVar8 = (int)puVar12;
    if (iVar2 != 0) goto LAB_0014af68;
    pcStack_4a0 = (code *)0x14ae8e;
    iVar2 = uv_interface_addresses((uv_interface_address_t **)&uStack_400,(int *)&uStack_460);
    if (iVar2 != 0) {
LAB_0014ae92:
      iVar8 = 0;
      pcStack_4a0 = (code *)0x14ae9c;
      iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014af6d;
    }
    puVar11 = (uv_connect_t *)uStack_400.data;
    if ((long)(int)uStack_460.data < 1) {
LAB_0014af54:
      pcStack_4a0 = (code *)0x14af59;
      uv_free_interface_addresses((uv_interface_address_t *)puVar11,(int)uStack_460.data);
      goto LAB_0014ae92;
    }
    psVar9 = (short *)((long)((long)uStack_400.data + 0x10) + 4);
    uVar7 = 1;
    do {
      sVar1 = *psVar9;
      if (sVar1 == 10) break;
      psVar9 = psVar9 + 0x28;
      bVar13 = uVar7 < (ulong)(long)(int)uStack_460.data;
      uVar7 = uVar7 + 1;
    } while (bVar13);
    pcStack_4a0 = (code *)0x14aef5;
    uv_free_interface_addresses((uv_interface_address_t *)uStack_400.data,(int)uStack_460.data);
    if (sVar1 != 10) goto LAB_0014ae92;
    puVar12 = &uStack_400;
    pcStack_4a0 = (code *)0x14af0b;
    iVar2 = uv_tcp_init(puVar6,puVar12);
    iVar8 = (int)puVar12;
    if (iVar2 != 0) goto LAB_0014af72;
    iVar8 = 0x23a3;
    pcStack_4a0 = (code *)0x14af25;
    iVar2 = uv_ip6_addr("::",0x23a3,&sStack_47c);
    if (iVar2 == 0) {
      puVar11 = &uStack_460;
      puVar12 = &uStack_400;
      pcStack_4a0 = (code *)0x14af47;
      iVar2 = uv_tcp_connect(puVar11,puVar12,(sockaddr *)&sStack_47c,connect_6);
      uStack_460.data._0_4_ = (int)puVar12;
      if (iVar2 != 0) {
        pcStack_4a0 = (code *)0x14af54;
        run_test_connect_unspecified_cold_6();
        goto LAB_0014af54;
      }
      goto LAB_0014ae92;
    }
  }
  else {
    pcStack_4a0 = (code *)0x14af63;
    run_test_connect_unspecified_cold_1();
LAB_0014af63:
    pcStack_4a0 = (code *)0x14af68;
    run_test_connect_unspecified_cold_2();
LAB_0014af68:
    pcStack_4a0 = (code *)0x14af6d;
    run_test_connect_unspecified_cold_3();
LAB_0014af6d:
    pcStack_4a0 = (code *)0x14af72;
    run_test_connect_unspecified_cold_7();
LAB_0014af72:
    pcStack_4a0 = (code *)0x14af77;
    run_test_connect_unspecified_cold_4();
  }
  pcStack_4a0 = connect_4;
  run_test_connect_unspecified_cold_5();
  if (iVar8 != -99) {
    return extraout_EAX;
  }
  pcStack_4a8 = connect_6;
  connect_4_cold_1();
  if (iVar8 != -99) {
    return extraout_EAX_00;
  }
  puStack_4b0 = (uv_loop_t *)run_test_connection_fail;
  connect_6_cold_1();
  loop = on_connect_with_close;
  puStack_4b8 = (uv_loop_t *)0x14afa1;
  puStack_4b0 = puVar6;
  connection_fail(on_connect_with_close);
  if (timer_close_cb_calls == 0) {
    if (timer_cb_calls != 0) goto LAB_0014aff0;
    puStack_4b8 = (uv_loop_t *)0x14afb8;
    puVar6 = uv_default_loop();
    puStack_4b8 = (uv_loop_t *)0x14afcc;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    puStack_4b8 = (uv_loop_t *)0x14afd6;
    uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_4b8 = (uv_loop_t *)0x14afdb;
    loop = (code *)uv_default_loop();
    puStack_4b8 = (uv_loop_t *)0x14afe3;
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_4b8 = (uv_loop_t *)0x14aff0;
    run_test_connection_fail_cold_1();
LAB_0014aff0:
    puStack_4b8 = (uv_loop_t *)0x14aff5;
    run_test_connection_fail_cold_2();
  }
  puStack_4b8 = (uv_loop_t *)connection_fail;
  run_test_connection_fail_cold_3();
  pcVar10 = "0.0.0.0";
  iVar8 = 0;
  puStack_4b8 = puVar6;
  iVar2 = uv_ip4_addr("0.0.0.0",0,&sStack_4c8);
  if (iVar2 == 0) {
    puVar11 = (uv_connect_t *)0x1a4b5a;
    iVar8 = 0x23a3;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4d8);
    if (iVar2 != 0) goto LAB_0014b0ad;
    puVar11 = (uv_connect_t *)uv_default_loop();
    iVar8 = 0x2f87f0;
    iVar2 = uv_tcp_init((uv_loop_t *)puVar11,&tcp);
    if (iVar2 != 0) goto LAB_0014b0b2;
    puVar12 = &tcp;
    addr = &sStack_4c8;
    iVar2 = uv_tcp_bind(&tcp,(sockaddr *)addr,0);
    iVar8 = (int)addr;
    puVar11 = (uv_connect_t *)puVar12;
    if (iVar2 != 0) goto LAB_0014b0b7;
    puVar11 = &req;
    iVar8 = 0x2f87f0;
    iVar2 = uv_tcp_connect(&req,&tcp,(sockaddr *)&sStack_4d8,loop);
    if (iVar2 != 0) goto LAB_0014b0bc;
    puVar11 = (uv_connect_t *)uv_default_loop();
    iVar8 = 0;
    iVar2 = uv_run((uv_loop_t *)puVar11,UV_RUN_DEFAULT);
    if (connect_cb_calls != 1) goto LAB_0014b0c1;
    if (close_cb_calls == 1) {
      return iVar2;
    }
  }
  else {
    connection_fail_cold_1();
    puVar11 = (uv_connect_t *)pcVar10;
LAB_0014b0ad:
    connection_fail_cold_2();
LAB_0014b0b2:
    connection_fail_cold_3();
LAB_0014b0b7:
    connection_fail_cold_4();
LAB_0014b0bc:
    connection_fail_cold_5();
LAB_0014b0c1:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)((uv_loop_t *)puVar11)->pending_queue[0] == &tcp) {
    if (iVar8 != -0x6f) goto LAB_0014b102;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      uv_close((uv_handle_t *)&tcp,on_close);
      return extraout_EAX_01;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0014b102:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  puVar6 = uv_default_loop();
  iVar8 = 0x2f8758;
  iVar2 = uv_timer_init(puVar6,&timer);
  if (iVar2 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014b180;
    if (timer_cb_calls == 1) {
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      iVar8 = 0;
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar2 = uv_loop_close(puVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014b18a;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014b180:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014b18a:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar8 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX_02;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(condvar_4) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_timedwait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  wc.wait_cond(&wc, &wc.posted_1);
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}